

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O3

bool Fossilize::decode_varint(uint32_t *words,size_t words_size,uint8_t *buffer,size_t buffer_size)

{
  uint8_t *puVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  
  if (words_size == 0) {
    sVar7 = 0;
    bVar4 = true;
  }
  else {
    bVar8 = false;
    uVar5 = 0;
    sVar7 = 0;
    do {
      words[uVar5] = 0;
      uVar3 = 0;
      uVar2 = 0;
      sVar6 = sVar7;
      do {
        sVar7 = sVar6;
        bVar4 = bVar8;
        if ((buffer_size <= sVar6) || (0x1f < uVar2)) goto LAB_0014e630;
        uVar3 = uVar3 | (buffer[sVar6] & 0x7f) << ((byte)uVar2 & 0x1f);
        words[uVar5] = uVar3;
        uVar2 = uVar2 + 7;
        sVar7 = sVar6 + 1;
        puVar1 = buffer + sVar6;
        sVar6 = sVar7;
      } while ((char)*puVar1 < '\0');
      uVar5 = uVar5 + 1;
      bVar8 = words_size <= uVar5;
      bVar4 = true;
    } while (uVar5 != words_size);
  }
LAB_0014e630:
  return (bool)(sVar7 == buffer_size & bVar4);
}

Assistant:

bool decode_varint(uint32_t *words, size_t words_size, const uint8_t *buffer, size_t buffer_size)
{
	size_t offset = 0;
	for (size_t i = 0; i < words_size; i++)
	{
		auto &w = words[i];
		w = 0;

		uint32_t shift = 0;
		do
		{
			if (offset >= buffer_size || shift >= 32u)
				return false;

			w |= (buffer[offset] & 0x7f) << shift;
			shift += 7;
		} while (buffer[offset++] & 0x80);
	}

	return buffer_size == offset;
}